

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_proxy_getPrototypeOf(JSContext *ctx,JSValue obj)

{
  JSValue obj_00;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue this_obj;
  JSValue func_obj;
  JSValue v_04;
  JSValue obj_01;
  JSValue obj_02;
  long lVar1;
  int iVar2;
  JSContext *ctx_00;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  int res;
  JSValue proto1;
  JSValue ret;
  JSValue method;
  JSProxyData *s;
  JSValueUnion in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion local_78;
  int64_t local_70;
  int in_stack_ffffffffffffff9c;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion JVar4;
  JSValueUnion in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  JSValueUnion in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  undefined4 local_38;
  JSAtom in_stack_ffffffffffffffcc;
  JSValue *in_stack_ffffffffffffffd0;
  JSContext *ctx_01;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar3.tag = in_RDX;
  JVar3.u.ptr = in_RSI.ptr;
  ctx_00 = (JSContext *)
           get_proxy_method((JSContext *)in_RDI.ptr,in_stack_ffffffffffffffd0,JVar3,
                            in_stack_ffffffffffffffcc);
  lVar1 = local_10;
  if (ctx_00 == (JSContext *)0x0) {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 6;
    return _local_10;
  }
  v_04.tag._0_4_ = local_38;
  v_04.u.ptr = (void *)in_stack_ffffffffffffffc0;
  v_04.tag._4_4_ = in_stack_ffffffffffffffcc;
  iVar2 = JS_IsUndefined(v_04);
  if (iVar2 != 0) {
    obj_01.tag = (int64_t)in_RSI.ptr;
    obj_01.u.ptr = in_RDI.ptr;
    JVar3 = JS_GetPrototype(ctx_00,obj_01);
    return JVar3;
  }
  func_obj.tag = in_stack_ffffffffffffffc0;
  func_obj.u.float64 = in_stack_ffffffffffffffb8.float64;
  this_obj.tag = in_stack_ffffffffffffffb0;
  this_obj.u.float64 = in_stack_ffffffffffffffa8.float64;
  ctx_01 = ctx_00;
  JVar3 = JS_CallFree(in_stack_ffffffffffffffa0,func_obj,this_obj,in_stack_ffffffffffffff9c,
                      (JSValue *)in_RSI.ptr);
  local_78 = JVar3.u;
  local_70 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 != 0) {
    local_8 = local_70;
    local_10.ptr = local_78.ptr;
    return _local_10;
  }
  if (((int)local_70 == 2) || ((int)local_70 == -1)) {
    obj_00.tag = (int64_t)in_stack_ffffffffffffff78.ptr;
    obj_00.u.float64 = in_stack_ffffffffffffff70.float64;
    iVar2 = JS_IsExtensible(ctx_00,obj_00);
    if (iVar2 < 0) {
      v.tag = in_stack_ffffffffffffff80;
      v.u.ptr = in_stack_ffffffffffffff78.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v);
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
      return _local_10;
    }
    if (iVar2 == 0) {
      obj_02.tag = (int64_t)in_RSI.ptr;
      obj_02.u.ptr = in_RDI.ptr;
      JVar3 = JS_GetPrototype(ctx_01,obj_02);
      in_stack_ffffffffffffff78 = JVar3.u;
      in_stack_ffffffffffffff80 = JVar3.tag;
      JVar4 = in_stack_ffffffffffffff78;
      iVar2 = JS_IsException(JVar3);
      if (iVar2 != 0) {
        v_00.tag = in_stack_ffffffffffffff80;
        v_00.u.ptr = in_stack_ffffffffffffff78.ptr;
        JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v_00);
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
        return _local_10;
      }
      if (JVar4.ptr != local_78.ptr) {
        v_01.tag = in_stack_ffffffffffffff80;
        v_01.u.ptr = in_stack_ffffffffffffff78.ptr;
        JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v_01);
        goto LAB_00126f31;
      }
      v_03.tag = in_stack_ffffffffffffff80;
      v_03.u.ptr = in_stack_ffffffffffffff78.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v_03);
    }
    local_8 = local_70;
    local_10.ptr = local_78.ptr;
  }
  else {
LAB_00126f31:
    v_02.tag = in_stack_ffffffffffffff80;
    v_02.u.ptr = in_stack_ffffffffffffff78.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v_02);
    _local_10 = JS_ThrowTypeError((JSContext *)in_RDI.ptr,"proxy: inconsistent prototype");
  }
  return _local_10;
}

Assistant:

static JSValue js_proxy_getPrototypeOf(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret, proto1;
    int res;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_getPrototypeOf);
    if (!s)
        return JS_EXCEPTION;
    if (JS_IsUndefined(method))
        return JS_GetPrototype(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return ret;
    if (JS_VALUE_GET_TAG(ret) != JS_TAG_NULL &&
        JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
        goto fail;
    }
    res = JS_IsExtensible(ctx, s->target);
    if (res < 0) {
        JS_FreeValue(ctx, ret);
        return JS_EXCEPTION;
    }
    if (!res) {
        /* check invariant */
        proto1 = JS_GetPrototype(ctx, s->target);
        if (JS_IsException(proto1)) {
            JS_FreeValue(ctx, ret);
            return JS_EXCEPTION;
        }
        if (JS_VALUE_GET_OBJ(proto1) != JS_VALUE_GET_OBJ(ret)) {
            JS_FreeValue(ctx, proto1);
        fail:
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "proxy: inconsistent prototype");
        }
        JS_FreeValue(ctx, proto1);
    }
    return ret;
}